

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghtbll(fitsfile *fptr,int maxfield,LONGLONG *naxis1,LONGLONG *naxis2,int *tfields,char **ttype
            ,LONGLONG *tbcol,char **tform,char **tunit,char *extnm,int *status)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  int *in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  LONGLONG pcount;
  LONGLONG llnaxis2;
  LONGLONG llnaxis1;
  char message [81];
  char xtension [71];
  char comm [73];
  char value [71];
  char name [75];
  long fields;
  int tstatus;
  int nfound;
  int maxf;
  int ii;
  long *in_stack_fffffffffffffdd8;
  LONGLONG *in_stack_fffffffffffffde0;
  LONGLONG *in_stack_fffffffffffffde8;
  LONGLONG *in_stack_fffffffffffffdf0;
  fitsfile *in_stack_fffffffffffffdf8;
  undefined8 local_200;
  char local_1f8 [16];
  int *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  fitsfile *in_stack_fffffffffffffe38;
  char local_198 [56];
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  char local_f8 [80];
  int *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff90;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_4;
  
  if (*(int *)llnaxis1 < 1) {
    ffgkyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
           in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    iVar2 = strcmp(&stack0xffffffffffffff58,"XTENSION");
    if (iVar2 == 0) {
      iVar2 = ffc2s((char *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                    (int *)in_stack_fffffffffffffde8);
      if (iVar2 < 1) {
        if ((local_f8[0] == '\'') && (iVar2 = strcmp(local_198,"TABLE"), iVar2 == 0)) {
          iVar2 = ffgttb(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8,(int *)0x1d2ec5);
          if (iVar2 < 1) {
            if (in_RDX != (undefined8 *)0x0) {
              *in_RDX = local_200;
            }
            if (in_RCX != (undefined8 *)0x0) {
              *in_RCX = in_stack_fffffffffffffdf8;
            }
            if (in_stack_fffffffffffffdf0 == (LONGLONG *)0x0) {
              local_40 = (int)local_50;
              if (in_R8 != (int *)0x0) {
                *in_R8 = local_40;
              }
              if (-1 < in_ESI) {
                if (in_ESI < local_50) {
                  local_50 = (long)in_ESI;
                }
                local_40 = (int)local_50;
              }
              if (0 < local_40) {
                for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
                  if (in_R9 != 0) {
                    **(undefined1 **)(in_R9 + (long)local_3c * 8) = 0;
                  }
                  if (pcount != 0) {
                    **(undefined1 **)(pcount + (long)local_3c * 8) = 0;
                  }
                }
                if (in_R9 != 0) {
                  ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff90);
                }
                if (pcount != 0) {
                  ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff90);
                }
                if (0 < *(int *)llnaxis1) {
                  return *(int *)llnaxis1;
                }
                if ((in_stack_00000008 != 0) &&
                   ((ffgknjj(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                             (LONGLONG *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff90), 0 < *(int *)llnaxis1 ||
                    (local_44 != local_40)))) {
                  ffpmsg((char *)0x1d3180);
                  *(undefined4 *)llnaxis1 = 0xe7;
                  return 0xe7;
                }
                if ((in_stack_00000010 != 0) &&
                   ((ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff90), 0 < *(int *)llnaxis1 ||
                    (local_44 != local_40)))) {
                  ffpmsg((char *)0x1d3214);
                  *(undefined4 *)llnaxis1 = 0xe8;
                  return 0xe8;
                }
              }
              if (llnaxis2 != 0) {
                *(undefined1 *)llnaxis2 = 0;
                uVar1 = *(undefined4 *)llnaxis1;
                ffgkys(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                if (*(int *)llnaxis1 == 0xca) {
                  *(undefined4 *)llnaxis1 = uVar1;
                }
              }
              local_4 = *(int *)llnaxis1;
            }
            else {
              snprintf(local_1f8,0x51,"PCOUNT = %.0f is illegal in ASCII table; must = 0",
                       (double)(long)in_stack_fffffffffffffdf0);
              ffpmsg((char *)0x1d2f47);
              *(undefined4 *)llnaxis1 = 0xd6;
              local_4 = 0xd6;
            }
          }
          else {
            local_4 = *(int *)llnaxis1;
          }
        }
        else {
          snprintf(local_1f8,0x51,"This is not a TABLE extension: %s",local_f8);
          ffpmsg((char *)0x1d2e31);
          *(undefined4 *)llnaxis1 = 0xe2;
          local_4 = 0xe2;
        }
      }
      else {
        ffpmsg((char *)0x1d2dbe);
        ffpmsg((char *)0x1d2dcb);
        local_4 = *(int *)llnaxis1;
      }
    }
    else {
      snprintf(local_1f8,0x51,"First keyword of the extension is not XTENSION: %s",
               &stack0xffffffffffffff58);
      ffpmsg((char *)0x1d2e7b);
      *(undefined4 *)llnaxis1 = 0xe1;
      local_4 = 0xe1;
    }
  }
  else {
    local_4 = *(int *)llnaxis1;
  }
  return local_4;
}

Assistant:

int ffghtbll(fitsfile *fptr, /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           LONGLONG *naxis1, /* O - length of table row in bytes             */
           LONGLONG *naxis2, /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           LONGLONG *tbcol, /* O - byte offset in row to each column        */
           char **tform,    /* O - value of TFORMn keyword for each column  */
           char **tunit,    /* O - value of TUNITn keyword for each column  */
           char *extnm,     /* O - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the ASCII TaBle:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG llnaxis1, llnaxis2, pcount;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "TABLE") ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a TABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_ATABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &llnaxis1, &llnaxis2, &pcount, &fields, status) > 0)
        return(*status);

    if (naxis1)
       *naxis1 = llnaxis1;

    if (naxis2)
       *naxis2 = llnaxis2;

    if (pcount != 0)
    {
       snprintf(message, FLEN_ERRMSG, "PCOUNT = %.0f is illegal in ASCII table; must = 0",
             (double) pcount);
       ffpmsg(message);
       return(*status = BAD_PCOUNT);
    }

    if (tfields)
       *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

   
        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tbcol)
        {
            ffgknjj(fptr, "TBCOL", 1, maxf, tbcol, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TBCOL keyword(s) not found in ASCII table header (ffghtbll).");
                return(*status = NO_TBCOL);
            }
        }

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in ASCII table header (ffghtbll).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
            *status = tstatus;  /* keyword not required, so ignore error */
    }

    return(*status);
}